

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTSoundBank_Stop(FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags)

{
  int in_EDX;
  uint16_t in_SI;
  long in_RDI;
  FACTCue *cue;
  FACTCue *backup;
  FACTCue *in_stack_00000028;
  FACTCue *pCue;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x114d2e);
    pCue = *(FACTCue **)(in_RDI + 8);
    while (pCue != (FACTCue *)0x0) {
      if (pCue->index == in_SI) {
        if ((in_EDX == 1) && (pCue->managed != '\0')) {
          pCue = pCue->next;
          FACTCue_Destroy(in_stack_00000028);
        }
        else {
          FACTCue_Stop(pCue,0);
          pCue = pCue->next;
        }
      }
      else {
        pCue = pCue->next;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x114dc5);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTSoundBank_Stop(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags
) {
	FACTCue *backup, *cue;
	if (pSoundBank == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
	cue = pSoundBank->cueList;
	while (cue != NULL)
	{
		if (cue->index == nCueIndex)
		{
			if (	dwFlags == FACT_FLAG_STOP_IMMEDIATE &&
				cue->managed	)
			{
				/* Just blow this up now */
				backup = cue->next;
				FACTCue_Destroy(cue);
				cue = backup;
			}
			else
			{
				/* If managed, the mixer will destroy for us */
				FACTCue_Stop(cue, dwFlags);
				cue = cue->next;
			}
		}
		else
		{
			cue = cue->next;
		}
	}
	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}